

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateArgInfo
          (ValidationState_t *_,Instruction *inst,uint32_t info_index)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  NonSemanticClspvReflectionInstructions NVar4;
  Instruction *this;
  long lVar5;
  char *pcVar6;
  DiagnosticStream DStack_1f8;
  
  uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)info_index);
  this = ValidationState_t::FindDef(_,uVar2);
  if ((this != (Instruction *)0x0) &&
     (bVar1 = spvIsExtendedInstruction((uint)(this->inst_).opcode), bVar1)) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(this,2);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    if (uVar2 != uVar3) {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar6 = "ArgInfo must be from the same extended instruction import";
      lVar5 = 0x39;
      goto LAB_002ec0b5;
    }
    NVar4 = Instruction::GetOperandAs<NonSemanticClspvReflectionInstructions>(this,3);
    if (NVar4 == NonSemanticClspvReflectionArgumentInfo) {
      return SPV_SUCCESS;
    }
  }
  ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
  pcVar6 = "ArgInfo must be an ArgumentInfo extended instruction";
  lVar5 = 0x34;
LAB_002ec0b5:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar6,lVar5);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateArgInfo(ValidationState_t& _, const Instruction* inst,
                             uint32_t info_index) {
  auto info = _.FindDef(inst->GetOperandAs<uint32_t>(info_index));
  if (!info || !spvIsExtendedInstruction(info->opcode())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "ArgInfo must be an ArgumentInfo extended instruction";
  }

  if (info->GetOperandAs<uint32_t>(2) != inst->GetOperandAs<uint32_t>(2)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "ArgInfo must be from the same extended instruction import";
  }

  auto ext_inst = info->GetOperandAs<NonSemanticClspvReflectionInstructions>(3);
  if (ext_inst != NonSemanticClspvReflectionArgumentInfo) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "ArgInfo must be an ArgumentInfo extended instruction";
  }

  return SPV_SUCCESS;
}